

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SupportVectorClassifier::InternalSwap
          (SupportVectorClassifier *this,SupportVectorClassifier *other)

{
  uint32 uVar1;
  int iVar2;
  Kernel *pKVar3;
  SupportVectorsUnion SVar4;
  ClassLabelsUnion CVar5;
  
  google::protobuf::RepeatedField<int>::InternalSwap
            (&this->numberofsupportvectorsperclass_,&other->numberofsupportvectorsperclass_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->coefficients_).super_RepeatedPtrFieldBase,
             &(other->coefficients_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->rho_,&other->rho_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->proba_,&other->proba_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->probb_,&other->probb_);
  pKVar3 = this->kernel_;
  this->kernel_ = other->kernel_;
  other->kernel_ = pKVar3;
  SVar4 = this->supportVectors_;
  this->supportVectors_ = other->supportVectors_;
  other->supportVectors_ = SVar4;
  uVar1 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar1;
  CVar5 = this->ClassLabels_;
  this->ClassLabels_ = other->ClassLabels_;
  other->ClassLabels_ = CVar5;
  uVar1 = this->_oneof_case_[1];
  this->_oneof_case_[1] = other->_oneof_case_[1];
  other->_oneof_case_[1] = uVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void SupportVectorClassifier::InternalSwap(SupportVectorClassifier* other) {
  numberofsupportvectorsperclass_.InternalSwap(&other->numberofsupportvectorsperclass_);
  coefficients_.InternalSwap(&other->coefficients_);
  rho_.InternalSwap(&other->rho_);
  proba_.InternalSwap(&other->proba_);
  probb_.InternalSwap(&other->probb_);
  std::swap(kernel_, other->kernel_);
  std::swap(supportVectors_, other->supportVectors_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(ClassLabels_, other->ClassLabels_);
  std::swap(_oneof_case_[1], other->_oneof_case_[1]);
  std::swap(_cached_size_, other->_cached_size_);
}